

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

bool __thiscall IR::RegOpnd::IsEqualInternal(RegOpnd *this,Opnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  IRType IVar3;
  IRType IVar4;
  undefined4 *puVar5;
  bool local_21;
  Opnd *opnd_local;
  RegOpnd *this_local;
  
  if ((this->super_Opnd).m_kind != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x4b6,"(m_kind == OpndKindReg)","m_kind == OpndKindReg");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = IsSameRegUntyped(this,opnd);
  local_21 = false;
  if (bVar2) {
    IVar3 = Opnd::GetType(&this->super_Opnd);
    IVar4 = Opnd::GetType(opnd);
    local_21 = IVar3 == IVar4;
  }
  return local_21;
}

Assistant:

bool
RegOpnd::IsEqualInternal(Opnd *opnd)
{
    Assert(m_kind == OpndKindReg);
    return IsSameRegUntyped(opnd) && (this->GetType() == opnd->GetType());
}